

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::reverse(SVInt *this)

{
  bool bVar1;
  bool bVar2;
  uint bits;
  uint uVar3;
  ulong uVar4;
  undefined8 ****ppppuVar5;
  ulong uVar6;
  undefined8 ****extraout_RDX;
  undefined8 ****ppppuVar7;
  undefined8 ****extraout_RDX_00;
  ulong *in_RSI;
  ulong uVar8;
  uint uVar9;
  SVInt SVar10;
  SVInt result;
  unsigned_long *__old_val;
  undefined8 ***local_50;
  uint local_48;
  undefined1 local_44;
  byte local_43;
  uint local_3c;
  undefined8 ***local_38;
  
  bits = (uint)in_RSI[1];
  bVar1 = *(bool *)((long)in_RSI + 0xd);
  if (bits < 0x41 && (bVar1 & 1U) == 0) {
    uVar4 = *in_RSI;
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    uVar4 = (uVar4 & 0xf0f0f0f0f0f0f0f) << 4 | uVar4 >> 4 & 0xf0f0f0f0f0f0f0f;
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333) * 4;
    SVInt(this,bits,
          (uVar4 >> 1 & 0x5555555555555555) + (uVar4 & 0x5555555555555555) * 2 >>
          (-(char)bits & 0x3fU),*(bool *)((long)in_RSI + 0xc));
    ppppuVar7 = extraout_RDX;
  }
  else {
    bVar2 = *(bool *)((long)in_RSI + 0xc);
    local_3c = bits + 0x3f;
    uVar9 = local_3c >> 6;
    local_50 = (undefined8 ***)operator_new__((ulong)((uVar9 << (bVar1 & 0x1fU)) << 3));
    if (bits < 0x41 && (bVar1 & 1U) == 0) {
      ppppuVar7 = &local_50;
    }
    else {
      in_RSI = (ulong *)*in_RSI;
      ppppuVar7 = (undefined8 ****)local_50;
    }
    uVar4 = (ulong)uVar9;
    local_48 = bits;
    local_44 = bVar2;
    local_43 = bVar1;
    local_38 = local_50;
    if (0x3f < local_3c) {
      uVar8 = 0;
      uVar3 = uVar9;
      do {
        uVar3 = uVar3 - 1;
        uVar6 = in_RSI[uVar3];
        uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
        uVar6 = (uVar6 & 0xf0f0f0f0f0f0f0f) << 4 | uVar6 >> 4 & 0xf0f0f0f0f0f0f0f;
        uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333) * 4;
        ppppuVar7[uVar8] =
             (undefined8 ***)((uVar6 >> 1 & 0x5555555555555555) + (uVar6 & 0x5555555555555555) * 2);
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    if (((bVar1 & 1U) != 0) && (0x3f < local_3c)) {
      uVar3 = uVar9 * 8;
      ppppuVar7 = (undefined8 ****)((long)ppppuVar7 + (ulong)uVar3);
      uVar8 = 0;
      do {
        uVar9 = uVar9 - 1;
        uVar6 = *(ulong *)((long)in_RSI + (ulong)uVar9 * 8 + (ulong)uVar3);
        uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
        uVar6 = (uVar6 & 0xf0f0f0f0f0f0f0f) << 4 | uVar6 >> 4 & 0xf0f0f0f0f0f0f0f;
        uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333) * 4;
        ppppuVar7[uVar8] =
             (undefined8 ***)((uVar6 >> 1 & 0x5555555555555555) + (uVar6 & 0x5555555555555555) * 2);
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    if ((bits & 0x3f) == 0) {
      (this->super_SVIntStorage).field_0.val = 0;
      (this->super_SVIntStorage).bitWidth = bits;
      (this->super_SVIntStorage).signFlag = bVar2;
      (this->super_SVIntStorage).unknownFlag = bVar1;
      ppppuVar5 = (undefined8 ****)local_50;
      if (bits >= 0x41 || (bVar1 & 1U) != 0) {
        local_50 = (undefined8 ****)0x0;
        ppppuVar5 = (undefined8 ****)local_38;
      }
      (this->super_SVIntStorage).field_0.pVal = (uint64_t *)ppppuVar5;
    }
    else {
      SVar10 = lshr(this,(bitwidth_t)&local_50);
      ppppuVar7 = SVar10.super_SVIntStorage._8_8_;
    }
    if (((0x40 < local_48) || ((local_43 & 1) != 0)) &&
       ((undefined8 ****)local_50 != (undefined8 ****)0x0)) {
      operator_delete__(local_50);
      ppppuVar7 = extraout_RDX_00;
    }
  }
  SVar10.super_SVIntStorage._8_8_ = ppppuVar7;
  SVar10.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar10.super_SVIntStorage;
}

Assistant:

SVInt SVInt::reverse() const {
    if (isSingleWord()) {
        uint64_t r = reverseBits64(val) >> (BITS_PER_WORD - bitWidth);
        return SVInt(bitWidth, r, signFlag);
    }

    auto result = SVInt::allocUninitialized(bitWidth, signFlag, unknownFlag);
    uint32_t words = getNumWords(bitWidth, false);
    uint64_t* dst = result.getRawData();
    const uint64_t* src = getRawData();

    for (uint32_t i = 0; i < words; i++)
        dst[i] = reverseBits64(src[words - i - 1]);

    if (unknownFlag) {
        dst += words;
        src += words;
        for (uint32_t i = 0; i < words; i++)
            dst[i] = reverseBits64(src[words - i - 1]);
    }

    // If we aren't aligned to a multiple of 64 bits, we need to shift
    // the result back down because we reversed some bits that weren't
    // actually included in the number.
    bitwidth_t msw = bitWidth % BITS_PER_WORD;
    if (msw != 0)
        return result.lshr(BITS_PER_WORD - msw);

    return result;
}